

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

PyObject * libxml_xmlSchemaFreeValidCtxt(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined8 uVar2;
  PyObject *pPVar3;
  xmlSchemaValidCtxtPyCtxtPtr pyCtxt;
  PyObject *pyobj_ctxt;
  undefined8 *local_20;
  undefined *local_18;
  
  pPVar3 = (PyObject *)0x0;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:xmlSchemaFreeValidCtxt",&local_18);
  if (iVar1 != 0) {
    if (local_18 == &_Py_NoneStruct) {
      uVar2 = 0;
    }
    else {
      uVar2 = *(undefined8 *)(local_18 + 0x10);
    }
    iVar1 = xmlSchemaGetValidErrors(uVar2,0,0,&local_20);
    if (local_20 != (undefined8 *)0x0 && iVar1 == 0) {
      _Py_XDECREF((PyObject *)local_20[1]);
      _Py_XDECREF((PyObject *)*local_20);
      _Py_XDECREF((PyObject *)local_20[2]);
      (*_xmlFree)(local_20);
    }
    xmlSchemaFreeValidCtxt(uVar2);
    pPVar3 = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  return pPVar3;
}

Assistant:

static PyObject *
libxml_xmlSchemaFreeValidCtxt(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
	xmlSchemaValidCtxtPtr ctxt;
	xmlSchemaValidCtxtPyCtxtPtr pyCtxt;
	PyObject *pyobj_ctxt;

	if (!PyArg_ParseTuple(args, (char *)"O:xmlSchemaFreeValidCtxt", &pyobj_ctxt))
		return(NULL);
	ctxt = (xmlSchemaValidCtxtPtr) PySchemaValidCtxt_Get(pyobj_ctxt);

	if (xmlSchemaGetValidErrors(ctxt, NULL, NULL, (void **) &pyCtxt) == 0)
	{
		if (pyCtxt != NULL)
		{
			Py_XDECREF(pyCtxt->error);
			Py_XDECREF(pyCtxt->warn);
			Py_XDECREF(pyCtxt->arg);
			xmlFree(pyCtxt);
		}
	}

	xmlSchemaFreeValidCtxt(ctxt);
	Py_INCREF(Py_None);
	return(Py_None);
}